

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O2

void __thiscall
avro::
NodeImpl<avro::concepts::NoAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
::setLeafToSymbolic(NodeImpl<avro::concepts::NoAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
                    *this,int index,NodePtr *node)

{
  element_type *peVar1;
  sp_counted_base *psVar2;
  _Alloc_hider this_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  reference pvVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  NodeSymbolic *this_01;
  undefined4 extraout_var_01;
  Exception *this_02;
  allocator<char> local_49;
  string local_48;
  
  pvVar6 = std::
           vector<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>::
           at(&(this->leafAttributes_).attrs_,(long)index);
  iVar4 = (*pvVar6->px->_vptr_Node[3])();
  iVar5 = (*node->px->_vptr_Node[3])();
  bVar3 = Name::operator!=((Name *)CONCAT44(extraout_var,iVar4),
                           (Name *)CONCAT44(extraout_var_00,iVar5));
  if (!bVar3) {
    this_01 = (NodeSymbolic *)operator_new(0x68);
    NodeSymbolic::NodeSymbolic(this_01);
    boost::shared_ptr<avro::Node>::shared_ptr<avro::NodeSymbolic>
              ((shared_ptr<avro::Node> *)&local_48,this_01);
    this_00._M_p = local_48._M_dataplus._M_p;
    iVar4 = (*node->px->_vptr_Node[3])();
    Node::setName((Node *)this_00._M_p,(Name *)CONCAT44(extraout_var_01,iVar4));
    boost::weak_ptr<avro::Node>::operator=((weak_ptr<avro::Node> *)(this_00._M_p + 0x58),node);
    peVar1 = pvVar6->px;
    psVar2 = (pvVar6->pn).pi_;
    pvVar6->px = (element_type *)local_48._M_dataplus._M_p;
    (pvVar6->pn).pi_ = (sp_counted_base *)local_48._M_string_length;
    local_48._M_dataplus._M_p = (pointer)peVar1;
    local_48._M_string_length = (size_type)psVar2;
    boost::detail::shared_count::~shared_count((shared_count *)&local_48._M_string_length);
    return;
  }
  this_02 = (Exception *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Symbolic name does not match the name of the schema it references"
             ,&local_49);
  Exception::Exception(this_02,&local_48);
  __cxa_throw(this_02,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

inline void 
NodeImpl<A,B,C,D>::setLeafToSymbolic(int index, const NodePtr &node)
{
    if(!B::hasAttribute) {
        throw Exception("Cannot change leaf node for nonexistent leaf");
    } 

    NodePtr &replaceNode = const_cast<NodePtr &>(leafAttributes_.get(index));
    if(replaceNode->name() != node->name()) {
        throw Exception("Symbolic name does not match the name of the schema it references");
    }

    NodePtr symbol(new NodeSymbolic);
    NodeSymbolic *ptr = static_cast<NodeSymbolic *> (symbol.get());

    ptr->setName(node->name());
    ptr->setNode(node);
    replaceNode.swap(symbol);
}